

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O2

void __thiscall
QRhiTextureUploadEntry::QRhiTextureUploadEntry
          (QRhiTextureUploadEntry *this,int layer,int level,
          QRhiTextureSubresourceUploadDescription *desc)

{
  this->m_layer = layer;
  this->m_level = level;
  QRhiTextureSubresourceUploadDescription::QRhiTextureSubresourceUploadDescription
            (&this->m_desc,desc);
  return;
}

Assistant:

QRhiTextureUploadEntry::QRhiTextureUploadEntry(int layer, int level,
                                               const QRhiTextureSubresourceUploadDescription &desc)
    : m_layer(layer),
      m_level(level),
      m_desc(desc)
{
}